

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formula.cpp
# Opt level: O2

void __thiscall
bal::Formula::add_named_variable(Formula *this,char *name,VariablesArray *value,variableid_t index)

{
  iterator iVar1;
  allocator local_69;
  char *local_68;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bal::VariablesArray>
  local_60;
  
  local_68 = name;
  std::__cxx11::string::string((string *)&local_60,name,&local_69);
  iVar1 = std::
          _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bal::VariablesArray>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bal::VariablesArray>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bal::VariablesArray>_>_>
          ::find(&(this->named_variables_)._M_t,&local_60.first);
  std::__cxx11::string::~string((string *)&local_60);
  if ((_Rb_tree_header *)iVar1._M_node ==
      &(this->named_variables_)._M_t._M_impl.super__Rb_tree_header) {
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bal::VariablesArray>
    ::pair<const_char_*const_&,_true>(&local_60,&local_68,value);
    std::
    _Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,bal::VariablesArray>,std::_Select1st<std::pair<std::__cxx11::string_const,bal::VariablesArray>>,std::less<std::__cxx11::string_const>,std::allocator<std::pair<std::__cxx11::string_const,bal::VariablesArray>>>
    ::_M_insert_unique<std::pair<std::__cxx11::string_const,bal::VariablesArray>>
              ((_Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,bal::VariablesArray>,std::_Select1st<std::pair<std::__cxx11::string_const,bal::VariablesArray>>,std::less<std::__cxx11::string_const>,std::allocator<std::pair<std::__cxx11::string_const,bal::VariablesArray>>>
                *)&this->named_variables_,&local_60);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bal::VariablesArray>
    ::~pair(&local_60);
  }
  else {
    VariablesArray::expand_elements((VariablesArray *)(iVar1._M_node + 2),index + 1);
    VariablesArray::assign_element((VariablesArray *)(iVar1._M_node + 2),value,index);
  }
  return;
}

Assistant:

void Formula::add_named_variable(const char* const name, const VariablesArray& value, const variableid_t index) {
        auto it = named_variables_.find(name);
        if (it == named_variables_.end()) {
            named_variables_.insert({name, value});
        } else {
            it->second.expand_elements(index + 1);
            it->second.assign_element(value, index);
        };
    }